

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ManDerive_rec(Gia_Man_t *pNew,Gia_Man_t *p,int Node,Vec_Int_t *vMirrors)

{
  int iVar1;
  int iVar2;
  int iLit0;
  int iLit1;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  
  iVar1 = Vec_IntEntry(vMirrors,Node);
  iVar2 = Node;
  if (-1 < iVar1) {
    iVar2 = Vec_IntEntry(vMirrors,Node);
    iVar2 = Abc_Lit2Var(iVar2);
  }
  pGVar4 = Gia_ManObj(p,iVar2);
  uVar3 = pGVar4->Value;
  if (uVar3 == 0xffffffff) {
    uVar3 = (uint)*(undefined8 *)pGVar4;
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x7e2,"void Sbd_ManDerive_rec(Gia_Man_t *, Gia_Man_t *, int, Vec_Int_t *)");
    }
    Sbd_ManDerive_rec(pNew,p,iVar2 - (uVar3 & 0x1fffffff),vMirrors);
    Sbd_ManDerive_rec(pNew,p,iVar2 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff),vMirrors);
    iVar1 = Gia_ObjIsXor(pGVar4);
    iLit0 = Gia_ObjFanin0Copy(pGVar4);
    iLit1 = Gia_ObjFanin1Copy(pGVar4);
    if (iVar1 == 0) {
      uVar3 = Gia_ManHashAnd(pNew,iLit0,iLit1);
    }
    else {
      uVar3 = Gia_ManHashXorReal(pNew,iLit0,iLit1);
    }
    pGVar4->Value = uVar3;
  }
  if (iVar2 != Node) {
    iVar2 = Vec_IntEntry(vMirrors,Node);
    iVar2 = Abc_LitIsCompl(iVar2);
    uVar3 = Abc_LitNotCond(uVar3,iVar2);
    pGVar4 = Gia_ManObj(p,Node);
    pGVar4->Value = uVar3;
  }
  return;
}

Assistant:

void Sbd_ManDerive_rec( Gia_Man_t * pNew, Gia_Man_t * p, int Node, Vec_Int_t * vMirrors )
{
    Gia_Obj_t * pObj;
    int Obj = Node;
    if ( Vec_IntEntry(vMirrors, Node) >= 0 )
        Obj = Abc_Lit2Var( Vec_IntEntry(vMirrors, Node) );
    pObj = Gia_ManObj( p, Obj );
    if ( !~pObj->Value )
    {
        assert( Gia_ObjIsAnd(pObj) );
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId0(pObj, Obj), vMirrors );
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId1(pObj, Obj), vMirrors );
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    // set the original node as well
    if ( Obj != Node )
        Gia_ManObj(p, Node)->Value = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(Vec_IntEntry(vMirrors, Node)) );
}